

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O3

void __thiscall
YAML::NodeEvents::Emit(NodeEvents *this,node *node,EventHandler *handler,AliasManager *am)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  node *node_00;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  node *__range2;
  value vVar6;
  const_node_iterator __begin2;
  const_node_iterator __end2;
  element_type *local_70;
  SeqIter local_68;
  MapIter local_60;
  const_node_iterator local_50;
  
  bVar3 = IsAliased(this,node);
  local_70 = (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  vVar6 = Undefined;
  if (bVar3) {
    p_Var5 = (am->m_anchorByIdentity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(am->m_anchorByIdentity)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        if (*(element_type **)(p_Var5 + 1) >= local_70) {
          p_Var4 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(element_type **)(p_Var5 + 1) < local_70];
      } while (p_Var5 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var4 != p_Var1) && (*(element_type **)(p_Var4 + 1) <= local_70)) &&
         (p_Var4[1]._M_parent != (_Base_ptr)0x0)) {
        local_70 = (element_type *)0x0;
        local_68._M_current = local_68._M_current & 0xffffffff00000000;
        (*handler->_vptr_EventHandler[5])(handler);
        return;
      }
    }
    local_68._M_current = (node **)(am->m_curAnchor + 1);
    am->m_curAnchor = (anchor_t)local_68._M_current;
    std::
    _Rb_tree<YAML::detail::node_ref_const*,std::pair<YAML::detail::node_ref_const*const,unsigned_long>,std::_Select1st<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>,std::less<YAML::detail::node_ref_const*>,std::allocator<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>>
    ::_M_emplace_unique<std::pair<YAML::detail::node_ref_const*,unsigned_long>>
              ((_Rb_tree<YAML::detail::node_ref_const*,std::pair<YAML::detail::node_ref_const*const,unsigned_long>,std::_Select1st<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>,std::less<YAML::detail::node_ref_const*>,std::allocator<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>>
                *)am,(pair<const_YAML::detail::node_ref_*,_unsigned_long> *)&local_70);
    local_70 = (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Var5 = (am->m_anchorByIdentity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        if (*(element_type **)(p_Var5 + 1) >= local_70) {
          p_Var4 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(element_type **)(p_Var5 + 1) < local_70];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(element_type **)(p_Var4 + 1) <= local_70)) {
        p_Var5 = p_Var4[1]._M_parent;
        goto LAB_0070fca5;
      }
    }
  }
  p_Var5 = (_Base_ptr)0x0;
LAB_0070fca5:
  peVar2 = (local_70->m_pData).
           super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->m_isDefined != false) {
    vVar6 = peVar2->m_type;
  }
  switch(vVar6) {
  case Null:
    local_70 = (element_type *)0x0;
    local_68._M_current = (node **)((ulong)local_68._M_current._4_4_ << 0x20);
    (*handler->_vptr_EventHandler[4])
              (handler,(node_iterator_base<const_YAML::detail::node> *)&local_70,p_Var5);
    return;
  case Scalar:
    local_70 = (element_type *)0x0;
    local_68._M_current = (node **)((ulong)local_68._M_current._4_4_ << 0x20);
    (*handler->_vptr_EventHandler[6])
              (handler,(node_iterator_base<const_YAML::detail::node> *)&local_70,&peVar2->m_tag,
               p_Var5,&peVar2->m_scalar);
    return;
  case Sequence:
    local_70 = (element_type *)0x0;
    local_68._M_current = (node **)((ulong)local_68._M_current._4_4_ << 0x20);
    (*handler->_vptr_EventHandler[7])
              (handler,(node_iterator_base<const_YAML::detail::node> *)&local_70,&peVar2->m_tag,
               p_Var5,(ulong)peVar2->m_style);
    detail::node_data::begin
              ((const_node_iterator *)&local_70,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    detail::node_data::end
              (&local_50,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case Map:
    local_70 = (element_type *)0x0;
    local_68._M_current = (node **)((ulong)local_68._M_current._4_4_ << 0x20);
    (*handler->_vptr_EventHandler[9])
              (handler,(node_iterator_base<const_YAML::detail::node> *)&local_70,&peVar2->m_tag,
               p_Var5,(ulong)peVar2->m_style);
    detail::node_data::begin
              ((const_node_iterator *)&local_70,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    detail::node_data::end
              (&local_50,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    do {
      if ((value)local_70 == local_50.m_type) {
        if ((value)local_70 == Sequence) {
          if (local_68._M_current == local_50.m_seqIt._M_current) {
LAB_0070fe4f:
            (*handler->_vptr_EventHandler[10])(handler);
            return;
          }
        }
        else if (((value)local_70 != Map) || (local_60._M_current == local_50.m_mapIt._M_current))
        goto LAB_0070fe4f;
      }
      node_00 = (local_60._M_current)->second;
      Emit(this,(local_60._M_current)->first,handler,am);
      Emit(this,node_00,handler,am);
      detail::node_iterator_base<const_YAML::detail::node>::operator++
                ((node_iterator_base<const_YAML::detail::node> *)&local_70);
    } while( true );
  default:
    return;
  }
  do {
    if ((value)local_70 == local_50.m_type) {
      if ((value)local_70 == Sequence) {
        if (local_68._M_current == local_50.m_seqIt._M_current) {
LAB_0070fd8f:
          (*handler->_vptr_EventHandler[8])(handler);
          return;
        }
      }
      else if (((value)local_70 != Map) || (local_60._M_current == local_50.m_mapIt._M_current))
      goto LAB_0070fd8f;
    }
    Emit(this,*local_68._M_current,handler,am);
    detail::node_iterator_base<const_YAML::detail::node>::operator++
              ((node_iterator_base<const_YAML::detail::node> *)&local_70);
  } while( true );
}

Assistant:

void NodeEvents::Emit(const detail::node& node, EventHandler& handler,
                      AliasManager& am) const {
  anchor_t anchor = NullAnchor;
  if (IsAliased(node)) {
    anchor = am.LookupAnchor(node);
    if (anchor) {
      handler.OnAlias(Mark(), anchor);
      return;
    }

    am.RegisterReference(node);
    anchor = am.LookupAnchor(node);
  }

  switch (node.type()) {
    case NodeType::Undefined:
      break;
    case NodeType::Null:
      handler.OnNull(Mark(), anchor);
      break;
    case NodeType::Scalar:
      handler.OnScalar(Mark(), node.tag(), anchor, node.scalar());
      break;
    case NodeType::Sequence:
      handler.OnSequenceStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node)
        Emit(*element, handler, am);
      handler.OnSequenceEnd();
      break;
    case NodeType::Map:
      handler.OnMapStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node) {
        Emit(*element.first, handler, am);
        Emit(*element.second, handler, am);
      }
      handler.OnMapEnd();
      break;
  }
}